

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O3

char Ver_StreamPopChar(Ver_Stream_t *p)

{
  char cVar1;
  char *pcVar2;
  
  if (p->fStop == 0) {
    pcVar2 = p->pBufferCur;
    if (p->pBufferStop < pcVar2) {
      Ver_StreamReload(p);
      pcVar2 = p->pBufferCur;
    }
    if (pcVar2 == p->pBufferEnd) {
      p->fStop = 1;
      cVar1 = -1;
    }
    else {
      if (*pcVar2 == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      p->pBufferCur = pcVar2 + 1;
      cVar1 = *pcVar2;
    }
    return cVar1;
  }
  __assert_fail("!p->fStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verStream.c"
                ,0x115,"char Ver_StreamPopChar(Ver_Stream_t *)");
}

Assistant:

char Ver_StreamPopChar( Ver_Stream_t * p )
{
    assert( !p->fStop );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // check if there are symbols left
    if ( p->pBufferCur == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return -1;
    }
    // count the lines
    if ( *p->pBufferCur == '\n' )
        p->nLineCounter++;
    return *p->pBufferCur++;
}